

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_FormatDouble_Test::TestBody(FormatterTest_FormatDouble_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char buffer [256];
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  undefined7 in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9e7;
  char (*in_stack_fffffffffffff9e8) [256];
  AssertHelper *expected;
  char *in_stack_fffffffffffff9f0;
  string *actual_expression;
  char *in_stack_fffffffffffff9f8;
  int line;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  undefined8 in_stack_fffffffffffffa08;
  Type TVar6;
  AssertHelper *pAVar5;
  AssertHelper *in_stack_fffffffffffffa10;
  char (*in_stack_fffffffffffffa18) [12];
  undefined7 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5f;
  AssertHelper *in_stack_fffffffffffffa60;
  AssertHelper *this_00;
  string local_4b8 [32];
  AssertionResult local_498 [2];
  undefined8 local_478;
  AssertHelper local_470 [4];
  AssertionResult local_450 [2];
  undefined8 local_430;
  string local_428 [8];
  char *in_stack_fffffffffffffbe0;
  char *in_stack_fffffffffffffbe8;
  double *in_stack_fffffffffffffbf0;
  AssertionResult local_408 [2];
  undefined8 local_3e8;
  string local_3e0 [32];
  AssertionResult local_3c0 [2];
  undefined8 local_3a0;
  string local_398 [32];
  AssertionResult local_378;
  AssertHelper local_368 [35];
  undefined8 local_250;
  string local_248 [32];
  AssertionResult local_228 [2];
  undefined8 local_208;
  string local_200 [32];
  AssertionResult local_1e0 [2];
  undefined8 local_1c0;
  string local_1b8 [32];
  AssertionResult local_198 [2];
  undefined8 local_178;
  string local_170 [32];
  AssertionResult local_150 [2];
  undefined8 local_130;
  string local_128 [32];
  AssertionResult local_108 [2];
  undefined8 local_e8;
  string local_e0 [32];
  AssertionResult local_c0 [2];
  undefined8 local_a0;
  string local_98 [32];
  AssertionResult local_78 [3];
  undefined8 local_48;
  string local_40 [32];
  AssertionResult local_20;
  undefined8 local_10;
  
  TVar6 = (Type)((ulong)in_stack_fffffffffffffa08 >> 0x20);
  local_10 = 0x3ff3333333333333;
  check_unknown_types<double>
            (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
  local_48 = 0;
  fmt::v5::format<char[4],double>
            ((char (*) [4])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [2])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16c488);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa60,
               (Message *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16c4eb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16c543);
  local_a0 = 0;
  fmt::v5::format<char[5],double>
            ((char (*) [5])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [9])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16c641);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa60,
               (Message *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16c6a4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16c6fc);
  local_e8 = 0;
  fmt::v5::format<char[5],double>
            ((char (*) [5])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [2])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16c7fa);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa60,
               (Message *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16c85d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16c8b5);
  local_130 = 0x40788a6666666666;
  fmt::v5::format<char[4],double>
            ((char (*) [4])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [7])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16c9b9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa60,
               (Message *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16ca1c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16ca74);
  local_178 = 0x40788a6666666666;
  fmt::v5::format<char[5],double>
            ((char (*) [5])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [7])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16cb78);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa60,
               (Message *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16cbdb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16cc33);
  local_1c0 = 0x40788a6666666666;
  fmt::v5::format<char[5],double>
            ((char (*) [5])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [7])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16cd37);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa60,
               (Message *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16cd9a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16cdf2);
  local_208 = 0x40788a6666666666;
  fmt::v5::format<char[5],double>
            ((char (*) [5])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [11])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16cef6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa60,
               (Message *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16cf59);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16cfb1);
  local_250 = 0x40788a6666666666;
  fmt::v5::format<char[5],double>
            ((char (*) [5])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [11])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_228);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16d0b5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffa60,
               (Message *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16d118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16d170);
  this_00 = local_368;
  safe_sprintf<256ul>((char (*) [256])0x40788a6666666666,(char *)this_00,"%e");
  local_3a0 = 0x40788a6666666666;
  fmt::v5::format<char[6],double>
            ((char (*) [6])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_398);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_378);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16d29b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16d2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16d350);
  safe_sprintf<256ul>((char (*) [256])0x40788a6666666666,(char *)local_368,"%E");
  local_3e8 = 0x40788a6666666666;
  fmt::v5::format<char[6],double>
            ((char (*) [6])in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_3e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    testing::AssertionResult::failure_message((AssertionResult *)0x16d469);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16d4c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16d51e);
  local_430 = 0x40788a6666666666;
  fmt::v5::format<char[12],double>(in_stack_fffffffffffffa18,(double *)in_stack_fffffffffffffa10);
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
             (char (*) [11])in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string(local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_408);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffa10);
    in_stack_fffffffffffffa18 =
         (char (*) [12])testing::AssertionResult::failure_message((AssertionResult *)0x16d616);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffa10,TVar6,
               (char *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16d673);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16d6cb);
  pAVar5 = local_368;
  safe_sprintf<256ul>((char (*) [256])0xc045000000000000,(char *)pAVar5,"%a");
  TVar6 = (Type)((ulong)pAVar5 >> 0x20);
  local_478 = 0xc045000000000000;
  pAVar5 = local_470;
  fmt::v5::format<char[5],double>((char (*) [5])in_stack_fffffffffffffa18,(double *)pAVar5);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  std::__cxx11::string::~string((string *)local_470);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_450);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)pAVar5);
    in_stack_fffffffffffff9f8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x16d7e4);
    testing::internal::AssertHelper::AssertHelper
              (pAVar5,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffffa00),
               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16d841);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16d899);
  expected = local_368;
  safe_sprintf<256ul>((char (*) [256])0xc045000000000000,(char *)expected,"%A");
  actual_expression = local_4b8;
  fmt::v5::format<char[5],double>((char (*) [5])in_stack_fffffffffffffa18,(double *)pAVar5);
  testing::internal::EqHelper<false>::Compare<char[256],std::__cxx11::string>
            (in_stack_fffffffffffff9f8,(char *)actual_expression,(char (*) [256])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
  line = (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20);
  std::__cxx11::string::~string(local_4b8);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_498);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)pAVar5);
    testing::AssertionResult::failure_message((AssertionResult *)0x16d9b2);
    testing::internal::AssertHelper::AssertHelper
              (pAVar5,TVar6,(char *)CONCAT17(uVar3,in_stack_fffffffffffffa00),line,
               (char *)actual_expression);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)CONCAT17(uVar2,in_stack_fffffffffffffa58));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar4,in_stack_fffffffffffff9e0));
    testing::Message::~Message((Message *)0x16da0d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x16da62);
  return;
}

Assistant:

TEST(FormatterTest, FormatDouble) {
  check_unknown_types(1.2, "eEfFgGaA", "double");
  EXPECT_EQ("0", format("{:}", 0.0));
  EXPECT_EQ("0.000000", format("{:f}", 0.0));
  EXPECT_EQ("0", format("{:g}", 0.0));
  EXPECT_EQ("392.65", format("{:}", 392.65));
  EXPECT_EQ("392.65", format("{:g}", 392.65));
  EXPECT_EQ("392.65", format("{:G}", 392.65));
  EXPECT_EQ("392.650000", format("{:f}", 392.65));
  EXPECT_EQ("392.650000", format("{:F}", 392.65));
  char buffer[BUFFER_SIZE];
  safe_sprintf(buffer, "%e", 392.65);
  EXPECT_EQ(buffer, format("{0:e}", 392.65));
  safe_sprintf(buffer, "%E", 392.65);
  EXPECT_EQ(buffer, format("{0:E}", 392.65));
  EXPECT_EQ("+0000392.6", format("{0:+010.4g}", 392.65));
  safe_sprintf(buffer, "%a", -42.0);
  EXPECT_EQ(buffer, format("{:a}", -42.0));
  safe_sprintf(buffer, "%A", -42.0);
  EXPECT_EQ(buffer, format("{:A}", -42.0));
}